

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeStamp.h
# Opt level: O2

void __thiscall KDIS::PDU::Data_Query_PDU::SetTimeInterval(Data_Query_PDU *this,TimeStamp *TI)

{
  (this->m_TimeInterval).m_bAutoCalcRel = TI->m_bAutoCalcRel;
  (this->m_TimeInterval).m_TimeStampUnion = TI->m_TimeStampUnion;
  return;
}

Assistant:

class KDIS_EXPORT TimeStamp : public DataTypeBase
{
protected:

    union
    {
        struct
        {
            KUINT32 m_ui32TimeStampType : 1;
            KUINT32 m_ui32Time          : 31;
        };
        KUINT32 m_ui32TimeStamp;
    } m_TimeStampUnion;

    KBOOL m_bAutoCalcRel;

public:

    static const KUINT16 TIME_STAMP_SIZE = 4;

    TimeStamp();

    TimeStamp(KDataStream &stream) noexcept(false);

    TimeStamp( KDIS::DATA_TYPE::ENUMS::TimeStampType T, KUINT32 Time, KBOOL AutoCalcRelative = false);

    virtual ~TimeStamp();

    //************************************
    // FullName:    KDIS::DATA_TYPE::TimeStamp::SetTimeStampType
    //              KDIS::DATA_TYPE::TimeStamp::GetTimeStampType
    // Description: Set the time stamp type, Absolute or Relative.
    // Parameter:   TimeStampType T
    //************************************
    void SetTimeStampType( KDIS::DATA_TYPE::ENUMS::TimeStampType T );
    KDIS::DATA_TYPE::ENUMS::TimeStampType GetTimeStampType() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::TimeStamp::SetTime
    //              KDIS::DATA_TYPE::TimeStamp::GetTime
    // Description: Time value. Scale of the time is determined
    //              by setting one hour equal to (2^31 - 1), thereby resulting
    //              in each time unit representing 3600 s/( 2^31 - 1 ) = 1.676 micro secs
    //              or 0.000001676 seconds. See EnumHeader.h for further details.
    //              Note: SetTimeStampAutoCalculate to true to allow KDIS to handle the time stamp.
    // Parameter:   TimeStampType T
    //************************************
    void SetTime( KUINT32 T );
    KUINT32 GetTime() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::TimeStamp::SetTimeStampAutoCalculate
    //              KDIS::DATA_TYPE::TimeStamp::IsTimeStampAutoCalculated
    // Description: Do you want the time stamp to be automatically calculated?
    //              Setting this to true will cause CalculateTimeStamp to be called every time
    //              the PDU is encoded.
    // Parameter:   KBOOL A
    //************************************
    void SetTimeStampAutoCalculate( KBOOL A );
    KBOOL IsTimeStampAutoCalculated() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::TimeStamp::CalculateRelativeTimeStamp
    // Description: Automatically calculates the timestamp for this moment in time.
    //************************************
    void CalculateTimeStamp();

    //************************************
    // FullName:    KDIS::DATA_TYPE::TimeStamp::GetAsString
    // Description: Returns a string representation.
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::TimeStamp::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::TimeStamp::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const TimeStamp & Value ) const;
    KBOOL operator != ( const TimeStamp & Value ) const;

    // Note: No check is made if the time stamps are of the same type.
    KBOOL operator < ( const TimeStamp & Value ) const;
}